

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipstream.cpp
# Opt level: O3

int64_t decodeInt(uint8_t **ptr)

{
  byte *pbVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  pbVar1 = *ptr;
  uVar3 = (ulong)*pbVar1;
  *ptr = pbVar1 + uVar3 + 1;
  if (uVar3 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      uVar4 = uVar3 - 1;
      uVar2 = uVar2 << 8 | (ulong)pbVar1[uVar3];
      uVar3 = uVar4;
    } while ((char)uVar4 != '\0');
  }
  return uVar2;
}

Assistant:

int64_t decodeInt(uint8_t const** ptr)
{
    auto* data = *ptr;
    auto sz = data[0];
    *ptr = &data[sz + 1];
    int64_t val = 0;
    while (sz > 0) {
        val <<= 8;
        val |= data[sz];
        sz--;
    }
    return val;
}